

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-binary-reader.cc
# Opt level: O3

void __thiscall BinaryReader_DisabledOpcodes_Test::TestBody(BinaryReader_DisabledOpcodes_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Enum EVar3;
  Opcode opcode;
  Result result;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  BinaryReaderError reader;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  Opcode local_100;
  Result local_fc;
  internal local_f8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined2 local_d4;
  undefined1 local_d2;
  uchar local_d1;
  uchar local_d0;
  uchar local_cf;
  undefined1 local_ce;
  AssertHelper local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  BinaryReaderDelegate local_a8;
  undefined4 local_98;
  undefined8 local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined8 uStack_7c;
  char *local_70;
  long local_68;
  char local_60 [16];
  ReadBinaryOptions local_50;
  
  local_50.features.exceptions_enabled_ = false;
  local_50.features.mutable_globals_enabled_ = true;
  local_50.features.sat_float_to_int_enabled_ = true;
  local_50.features.sign_extension_enabled_ = true;
  local_50.features.simd_enabled_ = false;
  local_50.features.threads_enabled_ = false;
  local_50.features.multi_value_enabled_ = true;
  local_50.features.gc_enabled_ = false;
  local_50.features.memory64_enabled_ = false;
  local_50.features.tail_call_enabled_ = false;
  local_50.features.bulk_memory_enabled_ = false;
  local_50.features.reference_types_enabled_ = false;
  local_50.features.annotations_enabled_ = false;
  local_50.log_stream = (Stream *)0x0;
  local_50.read_debug_names = false;
  local_50.stop_on_first_error = true;
  local_50.fail_on_custom_section_error = true;
  EVar3 = Unreachable;
  do {
    local_100.enum_ = EVar3;
    bVar1 = wabt::Opcode::IsEnabled(&local_100,&local_50.features);
    if (!bVar1) {
      wabt::Opcode::GetBytes(&local_c0,&local_100);
      if (3 < (ulong)((long)local_c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start)) {
        __assert_fail("b.size() <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                      ,0x34,"virtual void BinaryReader_DisabledOpcodes_Test::TestBody()");
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_c0,3);
      local_e8 = 0x16d736100;
      uStack_e0 = 0x203000060010401;
      local_d8 = 0x70a0001;
      local_d4 = 0x501;
      local_d2 = 0;
      local_d1 = *local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_d0 = local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
      local_cf = local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
      local_ce = 0xb;
      local_a8.state = (State *)0x0;
      local_a8._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderError_002c43c8;
      local_98 = 1;
      uStack_80 = 0;
      uStack_7c = 0;
      local_90 = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      local_70 = local_60;
      local_68 = 0;
      local_60[0] = '\0';
      local_fc = wabt::ReadBinary(&local_e8,0x1b,&local_a8,&local_50);
      local_108.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                (local_f8,"Result::Error","result",(Enum *)&local_108,&local_fc);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_108);
        pcVar2 = "";
        if (local_f0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((local_f0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                   ,0x43,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (local_108.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_108.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_108.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_c8.data_._0_4_ = 0;
      local_108.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::find((char *)&local_70,0x26d11d,0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_f8,"0u","message.find(\"unexpected opcode\")",(uint *)&local_c8,
                 (unsigned_long *)&local_108);
      if (local_f8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_108);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_108.ptr_ + 0x10),"Got error message: ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_108.ptr_ + 0x10),local_70,local_68);
        pcVar2 = "";
        if (local_f0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((local_f0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-binary-reader.cc"
                   ,0x48,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (local_108.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             (local_108.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_108.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_a8._vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderError_002c43c8;
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    EVar3 = EVar3 + Nop;
  } while (EVar3 != Invalid);
  return;
}

Assistant:

TEST(BinaryReader, DisabledOpcodes) {
  // Use the default features.
  ReadBinaryOptions options;

  // Loop through all opcodes.
  for (uint32_t i = 0; i < static_cast<uint32_t>(Opcode::Invalid); ++i) {
    Opcode opcode(static_cast<Opcode::Enum>(i));
    if (opcode.IsEnabled(options.features)) {
      continue;
    }

    // Use a shorter name to make the clang-formatted table below look nicer.
    std::vector<uint8_t> b = opcode.GetBytes();
    assert(b.size() <= 3);
    b.resize(3);

    uint8_t data[] = {
        0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00,  // magic + version
        0x01, 0x04, 0x01, 0x60, 0x00, 0x00,  // type section: 1 type, (func)
        0x03, 0x02, 0x01, 0x00,              // func section: 1 func, type 0
        0x0a, 0x07, 0x01, 0x05, 0x00,        // code section: 1 func, 0 locals
        b[0], b[1], b[2],  // The instruction, padded with zeroes
        0x0b,              // end
    };
    const size_t size = sizeof(data);

    BinaryReaderError reader;
    Result result = ReadBinary(data, size, &reader, options);
    EXPECT_EQ(Result::Error, result);

    // This relies on the binary reader checking whether the opcode is allowed
    // before reading any further data needed by the instruction.
    const std::string& message = reader.first_error.message;
    EXPECT_EQ(0u, message.find("unexpected opcode"))
        << "Got error message: " << message;
  }
}